

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

TestCase *
vkt::tessellation::anon_unknown_2::makeIdentityGeometryShaderCase
          (TestContext *testCtx,TessPrimitiveType primitiveType)

{
  TestContext *testCtx_00;
  IdentityGeometryShaderTestCase *this;
  char **value;
  allocator<char> local_b1;
  string local_b0;
  char *local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TessPrimitiveType local_14;
  TestContext *pTStack_10;
  TessPrimitiveType primitiveType_local;
  TestContext *testCtx_local;
  
  local_14 = primitiveType;
  pTStack_10 = testCtx;
  this = (IdentityGeometryShaderTestCase *)operator_new(0x78);
  testCtx_00 = pTStack_10;
  local_80 = getTessPrimitiveTypeShaderName(local_14);
  de::toString<char_const*>(&local_78,(de *)&local_80,value);
  std::operator+(&local_58,"tessellate_",&local_78);
  std::operator+(&local_38,&local_58,"_passthrough_geometry_no_change");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Passthrough geometry shader has no effect",&local_b1);
  IdentityGeometryShaderTestCase::IdentityGeometryShaderTestCase
            (this,testCtx_00,&local_38,&local_b0,local_14);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return &this->super_TestCase;
}

Assistant:

inline TestCase* makeIdentityGeometryShaderCase (tcu::TestContext& testCtx, const TessPrimitiveType primitiveType)
{
	return new IdentityGeometryShaderTestCase(
		testCtx,
		"tessellate_" + de::toString(getTessPrimitiveTypeShaderName(primitiveType)) + "_passthrough_geometry_no_change",
		"Passthrough geometry shader has no effect",
		primitiveType);
}